

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lyp.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinLYP>::eval_exc_unpolar_impl
               (double rho,double sigma,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double in_XMM1_Qa;
  double t62;
  double t56;
  double t54;
  double t53;
  double t50;
  double t45;
  double t44;
  double t41;
  double t40;
  double t37;
  double t36;
  double t35;
  double t31;
  double t29;
  double t28;
  double t27;
  double t26;
  double t18;
  double t16;
  double t15;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t5;
  double t4;
  double t2;
  double t1;
  double t49;
  double t24;
  double t21;
  double t48;
  double t23;
  double t20;
  
  dVar1 = safe_math::cbrt<double>(9.34703526806867e-318);
  dVar2 = 1.0 / ((1.0 / dVar1) * 0.349 + 1.0);
  dVar3 = safe_math::exp<double>(9.34765285012597e-318);
  dVar4 = (1.0 / (dVar1 * dVar1)) / (in_XMM0_Qa * in_XMM0_Qa);
  dVar1 = (dVar2 * 0.349 + 0.2533) * (1.0 / dVar1);
  dVar5 = safe_math::cbrt<double>(9.34913998771995e-318);
  dVar6 = piecewise_functor_3<double>(false,dVar5 * dVar5 * 1e-30,1.0);
  dVar5 = piecewise_functor_3<double>(false,dVar5 * dVar5 * 1e-30 * 1e-15,1.0);
  piecewise_functor_3<double>(false,1e-30,1.0);
  *in_RDI = (dVar3 * 0.132 * dVar2 *
             ((-(in_XMM1_Qa * dVar4) * (dVar1 * -0.09722222222222222 + -0.013888888888888888) +
               -(dVar6 * 2.8712340001881915) +
               ((2.5 - dVar1 / 18.0) * in_XMM1_Qa * dVar4 * dVar6) / 8.0 +
              ((dVar1 - 11.0) * in_XMM1_Qa * dVar4 * dVar5) / 144.0) -
             ((in_XMM1_Qa * 1.5874010519681996 * 1.3333333333333333 * dVar4 * dVar6 +
              -((in_XMM1_Qa * 1.0 * dVar4 * 1.5874010519681996 * dVar6) / 2.0)) * 1.2599210498948732
             ) / 8.0) + -dVar2) * 0.04918;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double& eps ) {

    (void)(eps);
    constexpr double t20 = constants::m_cbrt_3;
    constexpr double t23 = constants::m_cbrt_pi_sq;
    constexpr double t48 = constants::m_cbrt_2;
    constexpr double t21 = t20 * t20;
    constexpr double t24 = t23 * t23;
    constexpr double t49 = t48 * t48;


    const double t1 = safe_math::cbrt( rho );
    const double t2 = 0.1e1 / t1;
    const double t4 = d * t2 + 0.1e1;
    const double t5 = 0.1e1 / t4;
    const double t7 = safe_math::exp( -c * t2 );
    const double t8 = b * t7;
    const double t9 = rho * rho;
    const double t10 = t1 * t1;
    const double t12 = 0.1e1 / t10 / t9;
    const double t13 = sigma * t12;
    const double t15 = d * t5 + c;
    const double t16 = t15 * t2;
    const double t18 = -0.1e1 / 0.72e2 - 0.7e1 / 0.72e2 * t16;
    const double t26 = 0.1e1 <= zeta_tol;
    const double t27 = zeta_tol * zeta_tol;
    const double t28 = safe_math::cbrt( zeta_tol );
    const double t29 = t28 * t28;
    const double t31 = piecewise_functor_3( t26, t29 * t27, 1.0 );
    const double t35 = 0.5e1 / 0.2e1 - t16 / 0.18e2;
    const double t36 = t35 * sigma;
    const double t37 = t12 * t31;
    const double t40 = t16 - 0.11e2;
    const double t41 = t40 * sigma;
    const double t44 = piecewise_functor_3( t26, t29 * t27 * zeta_tol, 1.0 );
    const double t45 = t12 * t44;
    const double t50 = sigma * t49;
    const double t53 = piecewise_functor_3( t26, t27, 1.0 );
    const double t54 = t53 * sigma;
    const double t56 = t49 * t12 * t31;
    const double t62 = -t13 * t18 - 0.3e1 / 0.1e2 * t21 * t24 * t31 + t36 * t37 / 0.8e1 + t41 * t45 / 0.144e3 - t48 * ( 0.4e1 / 0.3e1 * t50 * t37 - t54 * t56 / 0.2e1 ) / 0.8e1;


    eps = a * ( t8 * t5 * t62 - t5 );

  }